

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O2

Comparison
Kernel::RationalConstantType::comparePrecedence(RationalConstantType *n1,RationalConstantType *n2)

{
  Comparison CVar1;
  IntegerConstantType IStack_68;
  IntegerConstantType local_58;
  IntegerConstantType local_48;
  IntegerConstantType local_38;
  
  IntegerConstantType::IntegerConstantType(&local_38,&n1->_den);
  IntegerConstantType::IntegerConstantType(&local_48,&n2->_den);
  CVar1 = IntegerConstantType::comparePrecedence(&local_38,&local_48);
  IntegerConstantType::~IntegerConstantType(&local_48);
  IntegerConstantType::~IntegerConstantType(&local_38);
  if (CVar1 == EQUAL) {
    IntegerConstantType::IntegerConstantType(&local_58,&n1->_num);
    IntegerConstantType::IntegerConstantType(&IStack_68,&n2->_num);
    CVar1 = IntegerConstantType::comparePrecedence(&local_58,&IStack_68);
    IntegerConstantType::~IntegerConstantType(&IStack_68);
    IntegerConstantType::~IntegerConstantType(&local_58);
  }
  return CVar1;
}

Assistant:

Comparison RationalConstantType::comparePrecedence(RationalConstantType n1, RationalConstantType n2)
{
  auto prec = IntegerConstantType::comparePrecedence(n1._den, n2._den);
  if (prec != EQUAL) return prec;
  return IntegerConstantType::comparePrecedence(n1._num, n2._num);
}